

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O3

bcf_sr_regions_t * bcf_sr_regions_init(char *regions,int is_file,int ichr,int ifrom,int ito)

{
  kh_str2int_t *h;
  khint_t kVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bcf_sr_regions_t *pbVar5;
  htsFile *fp;
  tbx_t *tbx;
  char **ppcVar6;
  void *pvVar7;
  char *pcVar8;
  size_t sVar9;
  undefined4 in_register_00000084;
  kh_str2int_t *hash;
  long lVar10;
  int *n;
  int from;
  undefined4 local_58;
  int to;
  char *chr;
  char *chr_end;
  char *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000084,ito);
  if (is_file == 0) {
    pbVar5 = _regions_init_string(regions);
    return pbVar5;
  }
  pbVar5 = (bcf_sr_regions_t *)calloc(1,0xb0);
  pbVar5->start = -1;
  pbVar5->end = -1;
  pbVar5->prev_seq = -1;
  pbVar5->prev_start = -1;
  fp = hts_open(regions,"rb");
  pbVar5->file = fp;
  if (fp == (htsFile *)0x0) {
    fprintf(_stderr,"[%s:%d %s] Could not open file: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
            ,0x3dd,"bcf_sr_regions_init",regions);
  }
  else {
    tbx = tbx_index_load(regions);
    pbVar5->tbx = tbx;
    if (tbx != (tbx_t *)0x0) {
      n = &pbVar5->nseqs;
      ppcVar6 = tbx_seqnames(tbx,n);
      pbVar5->seq_names = ppcVar6;
      if (pbVar5->seq_hash == (void *)0x0) {
        pvVar7 = calloc(1,0x28);
        pbVar5->seq_hash = pvVar7;
      }
      iVar2 = *n;
      if (0 < iVar2) {
        lVar10 = 0;
        do {
          h = (kh_str2int_t *)pbVar5->seq_hash;
          if (h != (kh_str2int_t *)0x0) {
            kVar1 = kh_put_str2int(h,pbVar5->seq_names[lVar10],(int *)&chr);
            h->vals[kVar1] = (int)lVar10;
            iVar2 = *n;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar2);
      }
      pcVar8 = strdup(regions);
      pbVar5->fname = pcVar8;
      pbVar5->is_bin = 1;
      return pbVar5;
    }
    sVar9 = strlen(regions);
    iVar2 = strcasecmp(".bed",regions + (long)(int)sVar9 + -4);
    local_40 = regions;
    if (iVar2 == 0) {
      local_58 = 0;
    }
    else {
      iVar2 = strcasecmp(".bed.gz",regions + (long)(int)sVar9 + -7);
      local_58 = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 != 0);
    }
    iVar2 = (int)local_38;
    if ((fp->format).format == vcf) {
      iVar2 = 1;
    }
    iVar3 = hts_getline(fp,2,&pbVar5->line);
    if (0 < iVar3) {
      iVar3 = -iVar2;
      if (0 < iVar2) {
        iVar3 = iVar2;
      }
      do {
        iVar4 = _regions_parse_line((pbVar5->line).s,ichr,ifrom,iVar3,&chr,&chr_end,&from,&to);
        if ((iVar4 < 0) &&
           ((-1 < iVar2 ||
            (iVar4 = _regions_parse_line((pbVar5->line).s,ichr,ifrom,ifrom,&chr,&chr_end,&from,&to),
            iVar4 < 0)))) {
          fprintf(_stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                  ,0x3f7,local_40,(ulong)(ichr + 1),(ulong)(ifrom + 1),(ulong)(iVar2 + 1));
          hts_close(pbVar5->file);
          goto LAB_00113b13;
        }
        pcVar8 = chr_end;
        if (iVar4 != 0) {
          if ((char)local_58 == '\0') {
            from = from + 1;
          }
          *chr_end = '\0';
          _regions_add(pbVar5,chr,from,to);
          *pcVar8 = '\t';
        }
        iVar4 = hts_getline(pbVar5->file,2,&pbVar5->line);
      } while (0 < iVar4);
    }
    hts_close(pbVar5->file);
    pbVar5->file = (htsFile *)0x0;
    if (pbVar5->nseqs != 0) {
      return pbVar5;
    }
  }
LAB_00113b13:
  free(pbVar5);
  return (bcf_sr_regions_t *)0x0;
}

Assistant:

bcf_sr_regions_t *bcf_sr_regions_init(const char *regions, int is_file, int ichr, int ifrom, int ito)
{
    bcf_sr_regions_t *reg;
    if ( !is_file ) return _regions_init_string(regions);

    reg = (bcf_sr_regions_t *) calloc(1, sizeof(bcf_sr_regions_t));
    reg->start = reg->end = -1;
    reg->prev_start = reg->prev_seq = -1;

    reg->file = hts_open(regions, "rb");
    if ( !reg->file )
    {
        fprintf(stderr,"[%s:%d %s] Could not open file: %s\n", __FILE__,__LINE__,__FUNCTION__,regions);
        free(reg);
        return NULL;
    }

    reg->tbx = tbx_index_load(regions);
    if ( !reg->tbx )
    {
        int len = strlen(regions);
        int is_bed  = strcasecmp(".bed",regions+len-4) ? 0 : 1;
        if ( !is_bed && !strcasecmp(".bed.gz",regions+len-7) ) is_bed = 1;

        if ( reg->file->format.format==vcf ) ito = 1;

        // read the whole file, tabix index is not present
        while ( hts_getline(reg->file, KS_SEP_LINE, &reg->line) > 0 )
        {
            char *chr, *chr_end;
            int from, to, ret;
            ret = _regions_parse_line(reg->line.s, ichr,ifrom,abs(ito), &chr,&chr_end,&from,&to);
            if ( ret < 0 )
            {
                if ( ito<0 )
                    ret = _regions_parse_line(reg->line.s, ichr,ifrom,ifrom, &chr,&chr_end,&from,&to);
                if ( ret<0 )
                {
                    fprintf(stderr,"[%s:%d] Could not parse the file %s, using the columns %d,%d[,%d]\n", __FILE__,__LINE__,regions,ichr+1,ifrom+1,ito+1);
                    hts_close(reg->file); reg->file = NULL; free(reg);
                    return NULL;
                }
            }
            if ( !ret ) continue;
            if ( is_bed ) from++;
            *chr_end = 0;
            _regions_add(reg, chr, from, to);
            *chr_end = '\t';
        }
        hts_close(reg->file); reg->file = NULL;
        if ( !reg->nseqs ) { free(reg); return NULL; }
        return reg;
    }

    reg->seq_names = (char**) tbx_seqnames(reg->tbx, &reg->nseqs);
    if ( !reg->seq_hash )
        reg->seq_hash = khash_str2int_init();
    int i;
    for (i=0; i<reg->nseqs; i++)
    {
        khash_str2int_set(reg->seq_hash,reg->seq_names[i],i);
    }
    reg->fname  = strdup(regions);
    reg->is_bin = 1;
    return reg;
}